

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O2

void golf_audio_update(float dt)

{
  int i;
  wchar_t num_frames;
  int iVar1;
  float *frames;
  float *mem;
  ulong uVar2;
  char *key;
  _sound_t *p_Var3;
  int j;
  long lVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  map_iter_t mVar9;
  float *buffer2;
  map_iter_t iter;
  
  num_frames = saudio_expect();
  if (L'\0' < num_frames) {
    uVar5 = (ulong)(uint)num_frames;
    frames = (float *)golf_alloc_tracked(uVar5 * 4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/audio.c"
                                        );
    mem = (float *)golf_alloc_tracked(uVar5 * 4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/audio.c"
                                     );
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      frames[uVar2] = 0.0;
    }
    buffer2 = mem;
    mVar9 = map_iter_();
    iter.node = mVar9.node;
    iter.bucketidx = mVar9.bucketidx;
    while( true ) {
      key = map_next_(&_sounds.base,&iter);
      if (key == (char *)0x0) break;
      p_Var3 = (_sound_t *)map_get_(&_sounds.base,key);
      _sounds.ref = p_Var3;
      if (p_Var3->on == true) {
        fVar7 = 1.0;
        if (p_Var3->stopping == true) {
          fVar6 = p_Var3->stopping_t + dt;
          p_Var3->stopping_t = fVar6;
          fVar7 = p_Var3->stopping_length;
          if (fVar7 < fVar6) {
            p_Var3->stopping_t = fVar7;
            p_Var3->on = false;
            p_Var3->stopping = false;
            fVar6 = fVar7;
          }
          fVar7 = 1.0 - fVar6 / fVar7;
        }
        stb_vorbis_seek(p_Var3->stream,p_Var3->cur_pos);
        iVar1 = stb_vorbis_get_samples_float(p_Var3->stream,1,&buffer2,num_frames);
        for (lVar4 = (long)iVar1; lVar4 < (long)uVar5; lVar4 = lVar4 + 1) {
          mem[lVar4] = 0.0;
        }
        for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
          fVar6 = p_Var3->volume * fVar7 * mem[uVar2];
          fVar8 = frames[uVar2] + fVar6;
          frames[uVar2] =
               fVar8 - fVar6 * frames[uVar2] * *(float *)(&DAT_002204f0 + (ulong)(0.0 < fVar8) * 4);
        }
        if (iVar1 == 0) {
          if (p_Var3->repeat == true) {
            p_Var3->cur_pos = 0;
          }
          else {
            p_Var3->on = false;
          }
        }
        p_Var3->cur_pos = p_Var3->cur_pos + iVar1;
      }
    }
    saudio_push(frames,num_frames);
    golf_free_tracked(mem);
    golf_free_tracked(frames);
  }
  return;
}

Assistant:

void golf_audio_update(float dt) {
    int num_samples = saudio_expect();
    if (num_samples <= 0) {
        return;
    }

    float *buffer = golf_alloc(sizeof(float) * num_samples);
    float *buffer2 = golf_alloc(sizeof(float) * num_samples);
    for (int i = 0; i < num_samples; i++) {
        buffer[i] = 0;
    }

    const char *key;
    map_iter_t iter = map_iter(&m);
    while ((key = map_next(&_sounds, &iter))) {
        _sound_t *s = map_get(&_sounds, key);
        float scale = 1;
        if (!s->on) continue;
        if (s->stopping) {
            s->stopping_t += dt;
            if (s->stopping_t > s->stopping_length) {
                s->stopping_t = s->stopping_length;
                s->stopping = false;
                s->on = false;
            }
            scale = 1 - s->stopping_t / s->stopping_length;
        }

        stb_vorbis_seek(s->stream, s->cur_pos);
        int n = stb_vorbis_get_samples_float(s->stream, 1, &buffer2, num_samples);
        for (int j = n; j < num_samples; j++) {
            buffer2[j] = 0;
        }
        for (int j = 0; j < num_samples; j++) {
            float a = buffer[j];
            float b = s->volume * scale * buffer2[j];
            float sign = (float) ((a + b) > 0 ? 1 : -1);
            buffer[j] = a + b - a * b * sign;
        }
        if (n == 0) {
            if (s->repeat) {
                s->cur_pos = 0;
            }
            else {
                s->on = false;
            }
        }
        s->cur_pos += n;
    }

    saudio_push(buffer, num_samples);
    golf_free(buffer2);
    golf_free(buffer);
}